

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-solver-c.cc
# Opt level: O2

NLW2_NLUtils_C * NLW2_MakeNLUtils_C_Default(void)

{
  NLW2_NLUtils_C *in_RDI;
  
  in_RDI->p_user_data_ = (void *)0x0;
  in_RDI->log_message = NLW2_log_message_C_Default;
  in_RDI->log_warning = NLW2_log_warning_C_Default;
  in_RDI->myexit = NLW2_myexit_C_Default;
  return in_RDI;
}

Assistant:

NLW2_NLUtils_C NLW2_MakeNLUtils_C_Default(void) {
  NLW2_NLUtils_C result;

  result.p_user_data_ = NULL;

  result.log_message = NLW2_log_message_C_Default;
  result.log_warning = NLW2_log_warning_C_Default;
  result.myexit = NLW2_myexit_C_Default;

  return result;
}